

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_10ddcf::FourNodesOnTwoLevels::FourNodesOnTwoLevels(FourNodesOnTwoLevels *this)

{
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_31;
  hash_function local_30;
  typed_address<pstore::index::header_block> local_28;
  FourNodesOnTwoLevels *local_10;
  FourNodesOnTwoLevels *this_local;
  
  local_10 = this;
  GenericIndexFixture::GenericIndexFixture(&this->super_GenericIndexFixture);
  (this->super_GenericIndexFixture).super_IndexFixture.super_Test._vptr_Test =
       (_func_int **)&PTR__FourNodesOnTwoLevels_003d1240;
  this_00 = (hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)operator_new(0x38);
  local_28 = pstore::typed_address<pstore::index::header_block>::null();
  hash_function::hash_function
            (&local_30,(map *)(anonymous_namespace)::FourNodesOnTwoLevels::hashes__abi_cxx11_);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::hamt_map(this_00,&(this->super_GenericIndexFixture).super_IndexFixture.db_,local_28,&local_30,
             &local_31);
  std::
  unique_ptr<pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>,std::default_delete<pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>>>
  ::
  unique_ptr<std::default_delete<pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>>,void>
            ((unique_ptr<pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>,std::default_delete<pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>>>
              *)&this->index_,this_00);
  return;
}

Assistant:

FourNodesOnTwoLevels ()
                : index_{new test_trie (db_,
                                        pstore::typed_address<pstore::index::header_block>::null (),
                                        hash_function{hashes_})} {}